

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O0

void __thiscall
TTD::ExecutionInfoManager::GetTimeAndPositionForDebugger
          (ExecutionInfoManager *this,TTDebuggerSourceLocation *sourceLocation)

{
  uint startOffset_00;
  LONG local_28;
  uint32 startOffset;
  LONG srcColumn;
  ULONG srcLine;
  SingleCallCounter *cfinfo;
  TTDebuggerSourceLocation *sourceLocation_local;
  ExecutionInfoManager *this_local;
  
  cfinfo = (SingleCallCounter *)sourceLocation;
  sourceLocation_local = (TTDebuggerSourceLocation *)this;
  _srcColumn = GetTopCallCounter(this);
  startOffset = 0;
  local_28 = -1;
  startOffset_00 =
       Js::FunctionBody::GetStatementStartOffset
                 (_srcColumn->Function,_srcColumn->CurrentStatementIndex);
  Js::FunctionBody::GetSourceLineFromStartOffset_TTD
            (_srcColumn->Function,startOffset_00,&startOffset,&local_28);
  TTDebuggerSourceLocation::SetLocationFull
            ((TTDebuggerSourceLocation *)cfinfo,this->m_topLevelCallbackEventTime,
             _srcColumn->FunctionTime,_srcColumn->LoopTime,_srcColumn->Function,startOffset,local_28
            );
  return;
}

Assistant:

void ExecutionInfoManager::GetTimeAndPositionForDebugger(TTDebuggerSourceLocation& sourceLocation) const
    {
        const SingleCallCounter& cfinfo = this->GetTopCallCounter();

        ULONG srcLine = 0;
        LONG srcColumn = -1;
        uint32 startOffset = cfinfo.Function->GetStatementStartOffset(cfinfo.CurrentStatementIndex);
        cfinfo.Function->GetSourceLineFromStartOffset_TTD(startOffset, &srcLine, &srcColumn);

        sourceLocation.SetLocationFull(this->m_topLevelCallbackEventTime, cfinfo.FunctionTime, cfinfo.LoopTime, cfinfo.Function, srcLine, srcColumn);
    }